

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntConv.H
# Opt level: O1

void amrex::readIntData<int,long>(int *data,size_t size,istream *is,IntDescriptor *id)

{
  Ordering OVar1;
  Ordering OVar2;
  int64_t in_RAX;
  IntDescriptor *this;
  size_t sVar3;
  long value;
  int64_t local_38;
  
  local_38 = in_RAX;
  OVar1 = IntDescriptor::order(id);
  this = FPC::NativeIntDescriptor();
  OVar2 = IntDescriptor::order(this);
  if (size != 0) {
    sVar3 = 0;
    do {
      std::istream::read((char *)is,(long)&local_38);
      if (OVar1 != OVar2) {
        local_38 = swapBytes(local_38);
      }
      data[sVar3] = (int)local_38;
      sVar3 = sVar3 + 1;
    } while (size != sVar3);
  }
  return;
}

Assistant:

void readIntData (To* data, std::size_t size, std::istream& is,
                      const amrex::IntDescriptor& id)
    {
        From value;
        bool swapEndian = (id.order() != amrex::FPC::NativeIntDescriptor().order());
        for (std::size_t j = 0; j < size; ++j) {
            is.read((char*) &value, sizeof(From));
            if (swapEndian) value = swapBytes(value);
            data[j] = static_cast<To>(value);
        }
    }